

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O3

void __thiscall
cuckoocache_tests::test_cuckoocache_no_fakes::test_method(test_cuckoocache_no_fakes *this)

{
  pointer puVar1;
  uchar *puVar2;
  uint uVar3;
  uint256 e;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  FastRandomContext *this_00;
  int iVar7;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Span<std::byte> output;
  const_string file;
  Span<std::byte> output_00;
  const_string msg;
  uint256 ret_1;
  uint256 ret;
  check_type cVar11;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  assertion_result local_130;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f8 [40];
  _Bit_iterator_base local_d0;
  _Bit_iterator_base local_c0;
  undefined1 local_b0 [16];
  uint8_t local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  lazy_ostream local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  local_f8._16_8_ = (pointer)0x0;
  local_f8._24_4_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._32_8_ = operator_new__(0);
  local_d0._M_p = (_Bit_type *)0x0;
  local_d0._M_offset = 0;
  local_d0._12_4_ = 0;
  local_c0._M_p = (_Bit_type *)0x0;
  local_c0._M_offset = 0;
  local_c0._12_4_ = 0;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = '\0';
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
            ((cache<uint256,_SignatureCacheHasher> *)local_f8,0x20000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar7 = 100000;
  do {
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    output.m_size = 0x20;
    output.m_data = local_78;
    FastRandomContext::fillrand(this_00,output);
    auVar9 = local_68;
    _cVar11 = (check_type)local_78._8_8_;
    e.super_base_blob<256U>.m_data._M_elems[0x10] = local_68[0];
    e.super_base_blob<256U>.m_data._M_elems[0x11] = local_68[1];
    e.super_base_blob<256U>.m_data._M_elems[0x12] = local_68[2];
    e.super_base_blob<256U>.m_data._M_elems[0x13] = local_68[3];
    e.super_base_blob<256U>.m_data._M_elems[0x14] = local_68[4];
    e.super_base_blob<256U>.m_data._M_elems[0x15] = local_68[5];
    e.super_base_blob<256U>.m_data._M_elems[0x16] = local_68[6];
    e.super_base_blob<256U>.m_data._M_elems[0x17] = local_68[7];
    e.super_base_blob<256U>.m_data._M_elems[0] = local_78[0];
    e.super_base_blob<256U>.m_data._M_elems[1] = local_78[1];
    e.super_base_blob<256U>.m_data._M_elems[2] = local_78[2];
    e.super_base_blob<256U>.m_data._M_elems[3] = local_78[3];
    e.super_base_blob<256U>.m_data._M_elems[4] = local_78[4];
    e.super_base_blob<256U>.m_data._M_elems[5] = local_78[5];
    e.super_base_blob<256U>.m_data._M_elems[6] = local_78[6];
    e.super_base_blob<256U>.m_data._M_elems[7] = local_78[7];
    e.super_base_blob<256U>.m_data._M_elems[8] = local_78[8];
    e.super_base_blob<256U>.m_data._M_elems[9] = local_78[9];
    e.super_base_blob<256U>.m_data._M_elems[10] = local_78[10];
    e.super_base_blob<256U>.m_data._M_elems[0xb] = local_78[0xb];
    e.super_base_blob<256U>.m_data._M_elems[0xc] = local_78[0xc];
    e.super_base_blob<256U>.m_data._M_elems[0xd] = local_78[0xd];
    e.super_base_blob<256U>.m_data._M_elems[0xe] = local_78[0xe];
    e.super_base_blob<256U>.m_data._M_elems[0xf] = local_78[0xf];
    e.super_base_blob<256U>.m_data._M_elems[0x18] = local_68[8];
    e.super_base_blob<256U>.m_data._M_elems[0x19] = local_68[9];
    e.super_base_blob<256U>.m_data._M_elems[0x1a] = local_68[10];
    e.super_base_blob<256U>.m_data._M_elems[0x1b] = local_68[0xb];
    e.super_base_blob<256U>.m_data._M_elems[0x1c] = local_68[0xc];
    e.super_base_blob<256U>.m_data._M_elems[0x1d] = local_68[0xd];
    e.super_base_blob<256U>.m_data._M_elems[0x1e] = local_68[0xe];
    e.super_base_blob<256U>.m_data._M_elems[0x1f] = local_68[0xf];
    local_68 = auVar9;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
              ((cache<uint256,_SignatureCacheHasher> *)local_f8,e);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 0;
  do {
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x30;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    output_00.m_size = 0x20;
    output_00.m_data = local_98;
    FastRandomContext::fillrand(this_00,output_00);
    uVar5 = (ulong)(uint)local_f8._24_4_;
    local_58._vptr_lazy_ostream =
         (_func_int **)
         CONCAT44((int)((uint)local_98._4_4_ * uVar5 >> 0x20),
                  (int)((uint)local_98._0_4_ * uVar5 >> 0x20));
    local_58._8_4_ = SUB84((uint)local_98._8_4_ * uVar5 >> 0x20,0);
    local_58._12_4_ = (int)((uint)local_98._12_4_ * uVar5 >> 0x20);
    local_48 = (undefined1 *)
               CONCAT44((int)((uint)local_88._4_4_ * uVar5 >> 0x20),
                        (int)((uint)local_88._0_4_ * uVar5 >> 0x20));
    local_40 = (char **)CONCAT44((int)((uint)local_88._12_4_ * uVar5 >> 0x20),
                                 (int)((uint)local_88._8_4_ * uVar5 >> 0x20));
    lVar6 = 0;
    do {
      uVar3 = *(uint *)((long)&local_58._vptr_lazy_ostream + lVar6);
      puVar1 = (pointer)(local_f8._0_8_ + (ulong)uVar3 * 0x20);
      puVar2 = (((pointer)(local_f8._0_8_ + (ulong)uVar3 * 0x20))->super_base_blob<256U>).m_data.
               _M_elems + 0x10;
      auVar10[0] = -(*puVar2 == local_88[0]);
      auVar10[1] = -(puVar2[1] == local_88[1]);
      auVar10[2] = -(puVar2[2] == local_88[2]);
      auVar10[3] = -(puVar2[3] == local_88[3]);
      auVar10[4] = -(puVar2[4] == local_88[4]);
      auVar10[5] = -(puVar2[5] == local_88[5]);
      auVar10[6] = -(puVar2[6] == local_88[6]);
      auVar10[7] = -(puVar2[7] == local_88[7]);
      auVar10[8] = -(puVar2[8] == local_88[8]);
      auVar10[9] = -(puVar2[9] == local_88[9]);
      auVar10[10] = -(puVar2[10] == local_88[10]);
      auVar10[0xb] = -(puVar2[0xb] == local_88[0xb]);
      auVar10[0xc] = -(puVar2[0xc] == local_88[0xc]);
      auVar10[0xd] = -(puVar2[0xd] == local_88[0xd]);
      auVar10[0xe] = -(puVar2[0xe] == local_88[0xe]);
      auVar10[0xf] = -(puVar2[0xf] == local_88[0xf]);
      auVar9[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_98[0]);
      auVar9[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == local_98[1]);
      auVar9[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == local_98[2]);
      auVar9[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == local_98[3]);
      auVar9[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == local_98[4]);
      auVar9[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == local_98[5]);
      auVar9[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == local_98[6]);
      auVar9[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == local_98[7]);
      auVar9[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == local_98[8]);
      auVar9[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == local_98[9]);
      auVar9[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == local_98[10]);
      auVar9[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == local_98[0xb]);
      auVar9[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == local_98[0xc]);
      auVar9[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == local_98[0xd]);
      auVar9[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == local_98[0xe]);
      auVar9[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == local_98[0xf]);
      auVar9 = auVar9 & auVar10;
      bVar8 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
      local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)!bVar8;
      if (bVar8) break;
      bVar8 = lVar6 != 0x1c;
      lVar6 = lVar6 + 4;
    } while (bVar8);
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_140 = "!cc.contains(m_rng.rand256(), false)";
    local_138 = "";
    local_58._8_4_ = local_58._8_4_ & 0xffffff00;
    local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = &local_140;
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_148 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_58,1,0,WARN,_cVar11,(size_t)&local_150,0x30);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    iVar7 = iVar7 + 1;
    if (iVar7 == 100000) {
      if (local_d0._M_p != (_Bit_type *)0x0) {
        operator_delete(local_d0._M_p,local_b0._0_8_ - (long)local_d0._M_p);
        local_d0._0_12_ = ZEXT812(0);
        local_c0._0_12_ = ZEXT812(0);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_b0._8_8_;
        local_b0 = auVar4 << 0x40;
      }
      if ((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)local_f8._32_8_ !=
          (_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)0x0) {
        operator_delete__((void *)local_f8._32_8_);
      }
      local_f8._32_8_ =
           (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
            )0x0;
      if ((pointer)local_f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(test_cuckoocache_no_fakes)
{
    SeedRandomForTest(SeedRand::ZEROS);
    CuckooCache::cache<uint256, SignatureCacheHasher> cc{};
    size_t megabytes = 4;
    cc.setup_bytes(megabytes << 20);
    for (int x = 0; x < 100000; ++x) {
        cc.insert(m_rng.rand256());
    }
    for (int x = 0; x < 100000; ++x) {
        BOOST_CHECK(!cc.contains(m_rng.rand256(), false));
    }
}